

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O1

Node<MeshLib::Edge> * __thiscall AVL::Node<MeshLib::Edge>::balance(Node<MeshLib::Edge> *this)

{
  Node<MeshLib::Edge> *pNVar1;
  Node<MeshLib::Edge> *pNVar2;
  int iVar3;
  int iVar4;
  
  while( true ) {
    pNVar1 = this->left;
    iVar4 = 0;
    iVar3 = 0;
    if (pNVar1 != (Node<MeshLib::Edge> *)0x0) {
      iVar3 = pNVar1->height;
    }
    pNVar2 = this->right;
    if (pNVar2 != (Node<MeshLib::Edge> *)0x0) {
      iVar4 = pNVar2->height;
    }
    if (0xfffffffc < (iVar3 - iVar4) - 2U) break;
    if (iVar3 - iVar4 < 0) {
      pNVar1 = pNVar2->left;
      iVar4 = 0;
      iVar3 = 0;
      if (pNVar1 != (Node<MeshLib::Edge> *)0x0) {
        iVar3 = pNVar1->height;
      }
      if (pNVar2->right != (Node<MeshLib::Edge> *)0x0) {
        iVar4 = pNVar2->right->height;
      }
      if (iVar4 < iVar3) {
        pNVar2->left = pNVar1->right;
        pNVar2 = balance(pNVar2);
        pNVar1->right = pNVar2;
        pNVar1 = balance(pNVar1);
        this->right = pNVar1;
      }
      pNVar1 = this->right;
      this->right = pNVar1->left;
      pNVar2 = balance(this);
      pNVar1->left = pNVar2;
      this = pNVar1;
    }
    else {
      iVar4 = 0;
      iVar3 = 0;
      if (pNVar1->left != (Node<MeshLib::Edge> *)0x0) {
        iVar3 = pNVar1->left->height;
      }
      pNVar2 = pNVar1->right;
      if (pNVar2 != (Node<MeshLib::Edge> *)0x0) {
        iVar4 = pNVar2->height;
      }
      if (iVar3 < iVar4) {
        pNVar1->right = pNVar2->left;
        pNVar1 = balance(pNVar1);
        pNVar2->left = pNVar1;
        pNVar1 = balance(pNVar2);
        this->left = pNVar1;
      }
      pNVar1 = this->left;
      this->left = pNVar1->right;
      pNVar2 = balance(this);
      pNVar1->right = pNVar2;
      this = pNVar1;
    }
  }
  compute_height(this);
  return this;
}

Assistant:

Node<T> * balance ()
    {
        int d = difference_in_height ();

        // only rotate if out of balance
        if (d < -1 || d > 1)
        {
            // too heavy on the right
            if (d < 0)
            {
                // if right child is too heavy on the left,
                // rotate right child to the right
                if (right -> difference_in_height () > 0)
                    right = right -> rotate_right ();

                // rotate current node to the left
                return rotate_left ();
            }
            // too heavy on the left
            else
            {
                // if left child is too heavy on the right,
                // rotate left child to the left
                if (left -> difference_in_height () < 0)
                    left = left -> rotate_left ();

                // rotate current node to the right
                return rotate_right ();
            }
        }

        // recompute the height of each node on the way up
        compute_height ();

        // otherwise, the node is balanced and we simply return it
        return this;
    }